

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

void Sbd_NtkPerformOne(Sbd_Man_t *p,int Pivot)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  Sbd_Par_t *pSVar6;
  ulong uVar7;
  int nStrs;
  word Truth;
  Sbd_Str_t Strs [10];
  
  Truth = 0;
  nStrs = 0;
  if ((p->pSto == (Sbd_Sto_t *)0x0) && (iVar3 = Sbd_ManMergeCuts(p,Pivot), iVar3 != 0)) {
    return;
  }
  iVar3 = Sbd_ManWindow(p,Pivot);
  if (iVar3 == 0) {
    return;
  }
  uVar1 = p->nTried;
  uVar2 = p->nUsed;
  p->nTried = uVar1 + 1;
  p->nUsed = uVar2 + 1;
  iVar3 = Sbd_ManCheckConst(p,Pivot);
  if (-1 < iVar3) {
    Vec_IntWriteEntry(p->vMirrors,Pivot,iVar3);
    return;
  }
  pSVar6 = p->pPars;
  if ((pSVar6->fFindDivs != 0) && (0 < pSVar6->nLutNum)) {
    iVar3 = Sbd_ManExplore2(p,Pivot,&Truth);
    if (iVar3 != 0) {
      Strs[0].fLut = 1;
      Strs[0].nVarIns = p->vDivSet->nSize;
      uVar7 = 0;
      uVar5 = (ulong)(uint)Strs[0].nVarIns;
      if (Strs[0].nVarIns < 1) {
        uVar5 = uVar7;
      }
      for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
        Strs[0].VarIns[uVar7] = (int)uVar7;
      }
      Strs[0].Res = Truth;
      iVar3 = 1;
      goto LAB_0045769f;
    }
    pSVar6 = p->pPars;
  }
  if ((pSVar6->nLutNum < 2) ||
     (iVar4 = Sbd_ManExplore3(p,Pivot,&nStrs,Strs), iVar3 = nStrs, iVar4 == 0)) {
    p->nUsed = p->nUsed + -1;
    return;
  }
LAB_0045769f:
  Sbd_ManImplement2(p,Pivot,iVar3,Strs);
  return;
}

Assistant:

void Sbd_NtkPerformOne( Sbd_Man_t * p, int Pivot )
{
    Sbd_Str_t Strs[SBD_DIV_MAX]; word Truth = 0;
    int RetValue, nStrs = 0;
    if ( !p->pSto && Sbd_ManMergeCuts( p, Pivot ) )
        return;
    if ( !Sbd_ManWindow( p, Pivot ) )
        return;
    //if ( Vec_IntSize(p->vWinObjs) > 100 )
    //    printf( "Obj %d : Win = %d   TFO = %d.  Roots = %d.\n", Pivot, Vec_IntSize(p->vWinObjs), Vec_IntSize(p->vTfo), Vec_IntSize(p->vRoots) );
    p->nTried++;
    p->nUsed++;
    RetValue = Sbd_ManCheckConst( p, Pivot );
    if ( RetValue >= 0 )
    {
        Vec_IntWriteEntry( p->vMirrors, Pivot, RetValue );
        //if ( p->pPars->fVerbose ) printf( "Node %5d:  Detected constant %d.\n", Pivot, RetValue );
    }
    else if ( p->pPars->fFindDivs && p->pPars->nLutNum >= 1 && Sbd_ManExplore2( p, Pivot, &Truth ) )
    {
        int i;
        Strs->fLut = 1;
        Strs->nVarIns = Vec_IntSize( p->vDivSet );
        for ( i = 0; i < Strs->nVarIns; i++ )
            Strs->VarIns[i] = i;
        Strs->Res = Truth;
        Sbd_ManImplement2( p, Pivot, 1, Strs );
        //if ( p->pPars->fVerbose ) printf( "Node %5d:  Detected LUT%d\n", Pivot, p->pPars->nLutSize );
    }
    else if ( p->pPars->nLutNum >= 2 && Sbd_ManExplore3( p, Pivot, &nStrs, Strs ) )
    {
        Sbd_ManImplement2( p, Pivot, nStrs, Strs );
        if ( !p->pPars->fVerbose ) 
            return;
        //if ( Vec_IntSize(p->vDivSet) <= 4 )
        //    printf( "Node %5d:  Detected %d\n", Pivot, p->pPars->nLutSize );
        //else if ( Vec_IntSize(p->vDivSet) <= 6 || (Vec_IntSize(p->vDivSet) == 7 && nStrs == 2) )
        //    printf( "Node %5d:  Detected %d%d\n", Pivot, p->pPars->nLutSize, p->pPars->nLutSize );
        //else 
        //    printf( "Node %5d:  Detected %d%d%d\n", Pivot, p->pPars->nLutSize, p->pPars->nLutSize, p->pPars->nLutSize );
    }
    else
        p->nUsed--;
}